

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
          *f)

{
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
  *this_00;
  wchar_t wVar1;
  alignment aVar2;
  unsigned_long __n;
  char *pcVar3;
  size_t left_padding;
  size_t padding;
  type pcStack_48;
  char_type fill;
  char **local_40;
  type *it;
  uint local_2c;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
  *ppStack_28;
  uint width;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
  *f_local;
  align_spec *spec_local;
  size_t size_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_local;
  
  ppStack_28 = f;
  f_local = (padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::hex_writer>
             *)spec;
  spec_local = (align_spec *)size;
  size_local = (size_t)this;
  local_2c = align_spec::width(spec);
  this_00 = ppStack_28;
  if (spec_local < (align_spec *)(ulong)local_2c) {
    pcStack_48 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
                 reserve((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                          *)this,(ulong)local_2c);
    local_40 = &stack0xffffffffffffffb8;
    wVar1 = align_spec::fill((align_spec *)f_local);
    padding._7_1_ = (undefined1)wVar1;
    __n = (ulong)local_2c - (long)spec_local;
    aVar2 = align_spec::align((align_spec *)f_local);
    if (aVar2 == ALIGN_RIGHT) {
      pcVar3 = std::fill_n<char*,unsigned_long,char>(*local_40,__n,(char *)((long)&padding + 7));
      *local_40 = pcVar3;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                    *)ppStack_28,local_40);
    }
    else {
      aVar2 = align_spec::align((align_spec *)f_local);
      if (aVar2 == ALIGN_CENTER) {
        pcVar3 = std::fill_n<char*,unsigned_long,char>
                           (*local_40,__n >> 1,(char *)((long)&padding + 7));
        *local_40 = pcVar3;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                      *)ppStack_28,local_40);
        pcVar3 = std::fill_n<char*,unsigned_long,char>
                           (*local_40,__n - (__n >> 1),(char *)((long)&padding + 7));
        *local_40 = pcVar3;
      }
      else {
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                      *)ppStack_28,local_40);
        pcVar3 = std::fill_n<char*,unsigned_long,char>(*local_40,__n,(char *)((long)&padding + 7));
        *local_40 = pcVar3;
      }
    }
  }
  else {
    it = (type *)basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
                 reserve((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                          *)this,(size_t)spec_local);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
                  *)this_00,(char **)&it);
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F &&f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}